

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

bool __thiscall Character::HasSpell(Character *this,short spell)

{
  bool bVar1;
  _Self local_40;
  short *local_38;
  _List_node_base *local_30;
  _List_iterator<Character_Spell> local_28;
  _Self local_20;
  short local_12;
  Character *pCStack_10;
  short spell_local;
  Character *this_local;
  
  local_12 = spell;
  pCStack_10 = this;
  local_28._M_node =
       (_List_node_base *)
       std::begin<std::__cxx11::list<Character_Spell,std::allocator<Character_Spell>>>
                 (&this->spells);
  local_30 = (_List_node_base *)
             std::end<std::__cxx11::list<Character_Spell,std::allocator<Character_Spell>>>
                       (&this->spells);
  local_38 = &local_12;
  local_20._M_node =
       (_List_node_base *)
       std::find_if<std::_List_iterator<Character_Spell>,Character::HasSpell(short)::__0>
                 (local_28,(_List_iterator<Character_Spell>)local_30,
                  (anon_class_8_1_a8a2f048_for__M_pred)local_38);
  local_40._M_node =
       (_List_node_base *)
       std::__cxx11::list<Character_Spell,_std::allocator<Character_Spell>_>::end(&this->spells);
  bVar1 = std::operator!=(&local_20,&local_40);
  return bVar1;
}

Assistant:

bool Character::HasSpell(short spell)
{
	return (std::find_if(UTIL_RANGE(this->spells), [&](Character_Spell cs) { return cs.id == spell; }) != this->spells.end());
}